

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::docstring_comment
          (t_netstd_generator *this,ostream *out,string *comment_start,string *line_prefix,
          string *contents,string *comment_end)

{
  string *psVar1;
  bool bVar2;
  byte bVar3;
  size_t sVar4;
  ostream *poVar5;
  byte local_65a;
  string local_638;
  string local_618;
  char local_5f8 [8];
  char line [1024];
  stringstream local_1f0 [8];
  stringstream docs;
  string local_58;
  string *local_38;
  string *comment_end_local;
  string *contents_local;
  string *line_prefix_local;
  string *comment_start_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_38 = comment_end;
  comment_end_local = contents;
  contents_local = line_prefix;
  line_prefix_local = comment_start;
  comment_start_local = (string *)out;
  out_local = (ostream *)this;
  bVar2 = std::operator!=(comment_start,"");
  psVar1 = comment_start_local;
  if (bVar2) {
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)psVar1,(string *)&local_58);
    std::operator<<(poVar5,(string *)line_prefix_local);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::stringstream::stringstream(local_1f0,(string *)comment_end_local,_S_in);
  while( true ) {
    bVar3 = std::ios::eof();
    local_65a = 1;
    if ((bVar3 & 1) == 0) {
      local_65a = std::ios::fail();
    }
    if (((local_65a ^ 0xff) & 1) == 0) break;
    std::istream::getline((char *)local_1f0,(long)local_5f8);
    sVar4 = strlen(local_5f8);
    if (((sVar4 == 0) && (bVar2 = std::operator==(contents_local,""), bVar2)) &&
       (bVar3 = std::ios::eof(), (bVar3 & 1) == 0)) {
      std::operator<<((ostream *)comment_start_local,(string *)&::endl_abi_cxx11_);
    }
    else {
      sVar4 = strlen(local_5f8);
      if ((sVar4 != 0) || (bVar3 = std::ios::eof(), (bVar3 & 1) == 0)) {
        psVar1 = comment_start_local;
        t_generator::indent_abi_cxx11_(&local_618,(t_generator *)this);
        poVar5 = std::operator<<((ostream *)psVar1,(string *)&local_618);
        poVar5 = std::operator<<(poVar5,(string *)contents_local);
        poVar5 = std::operator<<(poVar5,local_5f8);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_618);
      }
    }
  }
  bVar2 = std::operator!=(local_38,"");
  psVar1 = comment_start_local;
  if (bVar2) {
    t_generator::indent_abi_cxx11_(&local_638,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)psVar1,(string *)&local_638);
    std::operator<<(poVar5,(string *)local_38);
    std::__cxx11::string::~string((string *)&local_638);
  }
  std::__cxx11::stringstream::~stringstream(local_1f0);
  return;
}

Assistant:

void t_netstd_generator::docstring_comment(ostream& out, const string& comment_start, const string& line_prefix, const string& contents, const string& comment_end)
{
    if (comment_start != "")
    {
        out << indent() << comment_start;
    }

    stringstream docs(contents, std::ios_base::in);

    while (!(docs.eof() || docs.fail()))
    {
        char line[1024];
        docs.getline(line, 1024);

        // Just prnt a newline when the line & prefix are empty.
        if (strlen(line) == 0 && line_prefix == "" && !docs.eof())
        {
            out << endl;
        }
        else if (strlen(line) > 0 || !docs.eof())
        { // skip the empty last line
            out << indent() << line_prefix << line << endl;
        }
    }
    if (comment_end != "")
    {
        out << indent() << comment_end;
    }
}